

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgetfactory.cpp
# Opt level: O0

QAccessibleInterface * qAccessibleFactory(QString *classname,QObject *object)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *pQVar3;
  void *pvVar4;
  QWidget *in_RSI;
  QAccessibleWindowContainer *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  QAccessibleInterface *iface;
  QWidget *in_stack_fffffffffffff848;
  QAccessibleTable *in_stack_fffffffffffff850;
  QWidget *in_stack_fffffffffffff858;
  QAccessibleAbstractSpinBox *in_stack_fffffffffffff860;
  Role RVar5;
  QWidget *in_stack_fffffffffffff868;
  QAccessibleDisplay *in_stack_fffffffffffff870;
  QWidget *in_stack_fffffffffffff878;
  QWidget *in_stack_fffffffffffff880;
  QAccessibleLineEdit *in_stack_fffffffffffff888;
  QWidget *local_610;
  QWidget *local_5f8;
  QWidget *local_5e0;
  bool local_549;
  bool local_4e1;
  QWidget *local_438;
  QWidget *local_420;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_438 = (QWidget *)0x0;
  if ((in_RSI == (QWidget *)0x0) || (bVar2 = QObject::isWidgetType((QObject *)0x7e1290), !bVar2)) {
    local_420 = (QWidget *)0x0;
  }
  else {
    pQVar3 = QWidgetPrivate::get((QWidget *)0x7e12c6);
    if ((*(uint *)&(pQVar3->data).field_0x10 >> 0x12 & 1) == 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
      bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                         (QLatin1StringView *)in_stack_fffffffffffff850);
      if (bVar2) {
        QObject::objectName();
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
        bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                           (QLatin1StringView *)in_stack_fffffffffffff850);
        QString::~QString((QString *)0x7e139a);
        if (bVar2) {
          local_438 = (QWidget *)0x0;
        }
        else {
          local_438 = (QWidget *)operator_new(0x30);
          QString::QString((QString *)0x7e13e4);
          QAccessibleLineEdit::QAccessibleLineEdit
                    (in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                     (QString *)in_stack_fffffffffffff878);
          QString::~QString((QString *)0x7e141e);
        }
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
        bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                           (QLatin1StringView *)in_stack_fffffffffffff850);
        if (bVar2) {
          local_438 = (QWidget *)operator_new(0x20);
          QAccessibleComboBox::QAccessibleComboBox
                    ((QAccessibleComboBox *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
        }
        else {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
          bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                             (QLatin1StringView *)in_stack_fffffffffffff850);
          if (bVar2) {
            local_438 = (QWidget *)operator_new(0x40);
            QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox
                      (in_stack_fffffffffffff860,in_stack_fffffffffffff858);
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
            bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                               (QLatin1StringView *)in_stack_fffffffffffff850);
            if (bVar2) {
              local_438 = (QWidget *)operator_new(0x40);
              QAccessibleSpinBox::QAccessibleSpinBox
                        ((QAccessibleSpinBox *)in_stack_fffffffffffff870,in_stack_fffffffffffff868);
            }
            else {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
              bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                 (QLatin1StringView *)in_stack_fffffffffffff850);
              if (bVar2) {
                local_438 = (QWidget *)operator_new(0x40);
                QAccessibleDoubleSpinBox::QAccessibleDoubleSpinBox
                          ((QAccessibleDoubleSpinBox *)in_stack_fffffffffffff870,
                           in_stack_fffffffffffff868);
              }
              else {
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
                bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                   (QLatin1StringView *)in_stack_fffffffffffff850);
                if (bVar2) {
                  local_438 = (QWidget *)operator_new(0x28);
                  QAccessibleScrollBar::QAccessibleScrollBar
                            ((QAccessibleScrollBar *)in_stack_fffffffffffff870,
                             in_stack_fffffffffffff868);
                }
                else {
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
                  bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                     (QLatin1StringView *)in_stack_fffffffffffff850);
                  if (bVar2) {
                    local_438 = (QWidget *)operator_new(0x28);
                    QAccessibleAbstractSlider::QAccessibleAbstractSlider
                              ((QAccessibleAbstractSlider *)in_stack_fffffffffffff870,
                               in_stack_fffffffffffff868,
                               (Role)((ulong)in_stack_fffffffffffff860 >> 0x20));
                  }
                  else {
                    Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850);
                    bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                       (QLatin1StringView *)in_stack_fffffffffffff850);
                    if (bVar2) {
                      local_438 = (QWidget *)operator_new(0x28);
                      QAccessibleSlider::QAccessibleSlider
                                ((QAccessibleSlider *)in_stack_fffffffffffff870,
                                 in_stack_fffffffffffff868);
                    }
                    else {
                      Qt::Literals::StringLiterals::operator____L1
                                ((char *)in_stack_fffffffffffff858,(size_t)in_stack_fffffffffffff850
                                );
                      bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                         (QLatin1StringView *)in_stack_fffffffffffff850);
                      if (bVar2) {
                        local_438 = (QWidget *)operator_new(0x20);
                        QAccessibleToolButton::QAccessibleToolButton
                                  ((QAccessibleToolButton *)in_stack_fffffffffffff850,
                                   in_stack_fffffffffffff848);
                      }
                      else {
                        Qt::Literals::StringLiterals::operator____L1
                                  ((char *)in_stack_fffffffffffff858,
                                   (size_t)in_stack_fffffffffffff850);
                        bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                           (QLatin1StringView *)in_stack_fffffffffffff850);
                        local_4e1 = true;
                        if (!bVar2) {
                          Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff858,
                                     (size_t)in_stack_fffffffffffff850);
                          bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                             (QLatin1StringView *)in_stack_fffffffffffff850);
                          local_4e1 = true;
                          if (!bVar2) {
                            Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffff858,
                                       (size_t)in_stack_fffffffffffff850);
                            bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                               (QLatin1StringView *)in_stack_fffffffffffff850);
                            local_4e1 = true;
                            if (!bVar2) {
                              Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffff858,
                                         (size_t)in_stack_fffffffffffff850);
                              local_4e1 = operator==((QString *)in_stack_fffffffffffff858,
                                                     (QLatin1StringView *)in_stack_fffffffffffff850)
                              ;
                            }
                          }
                        }
                        if (local_4e1 == false) {
                          Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff858,
                                     (size_t)in_stack_fffffffffffff850);
                          bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                             (QLatin1StringView *)in_stack_fffffffffffff850);
                          if (bVar2) {
                            local_438 = (QWidget *)operator_new(0x20);
                            RVar5 = (Role)((ulong)in_stack_fffffffffffff860 >> 0x20);
                            QString::QString((QString *)0x7e1a56);
                            QAccessibleWidget::QAccessibleWidget
                                      (&in_stack_fffffffffffff870->super_QAccessibleWidget,
                                       in_stack_fffffffffffff868,RVar5,
                                       (QString *)in_stack_fffffffffffff858);
                            QString::~QString((QString *)0x7e1a95);
                          }
                          else {
                            Qt::Literals::StringLiterals::operator____L1
                                      ((char *)in_stack_fffffffffffff858,
                                       (size_t)in_stack_fffffffffffff850);
                            bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                               (QLatin1StringView *)in_stack_fffffffffffff850);
                            if (bVar2) {
                              local_438 = (QWidget *)operator_new(0x20);
                              QAccessibleMessageBox::QAccessibleMessageBox
                                        ((QAccessibleMessageBox *)in_stack_fffffffffffff860,
                                         in_stack_fffffffffffff858);
                            }
                            else {
                              Qt::Literals::StringLiterals::operator____L1
                                        ((char *)in_stack_fffffffffffff858,
                                         (size_t)in_stack_fffffffffffff850);
                              bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                 (QLatin1StringView *)in_stack_fffffffffffff850);
                              if (bVar2) {
                                local_438 = (QWidget *)operator_new(0x20);
                                QAccessibleMainWindow::QAccessibleMainWindow
                                          ((QAccessibleMainWindow *)in_stack_fffffffffffff860,
                                           in_stack_fffffffffffff858);
                              }
                              else {
                                Qt::Literals::StringLiterals::operator____L1
                                          ((char *)in_stack_fffffffffffff858,
                                           (size_t)in_stack_fffffffffffff850);
                                bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                   (QLatin1StringView *)in_stack_fffffffffffff850);
                                local_549 = true;
                                if (!bVar2) {
                                  Qt::Literals::StringLiterals::operator____L1
                                            ((char *)in_stack_fffffffffffff858,
                                             (size_t)in_stack_fffffffffffff850);
                                  local_549 = operator==((QString *)in_stack_fffffffffffff858,
                                                         (QLatin1StringView *)
                                                         in_stack_fffffffffffff850);
                                }
                                if (local_549 == false) {
                                  Qt::Literals::StringLiterals::operator____L1
                                            ((char *)in_stack_fffffffffffff858,
                                             (size_t)in_stack_fffffffffffff850);
                                  bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                     (QLatin1StringView *)in_stack_fffffffffffff850)
                                  ;
                                  if (bVar2) {
                                    local_438 = (QWidget *)operator_new(0x20);
                                    QAccessibleGroupBox::QAccessibleGroupBox
                                              ((QAccessibleGroupBox *)in_stack_fffffffffffff860,
                                               in_stack_fffffffffffff858);
                                  }
                                  else {
                                    Qt::Literals::StringLiterals::operator____L1
                                              ((char *)in_stack_fffffffffffff858,
                                               (size_t)in_stack_fffffffffffff850);
                                    bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                       (QLatin1StringView *)
                                                       in_stack_fffffffffffff850);
                                    if (bVar2) {
                                      local_438 = (QWidget *)operator_new(0x28);
                                      QAccessibleDisplay::QAccessibleDisplay
                                                (in_stack_fffffffffffff870,in_stack_fffffffffffff868
                                                 ,(Role)((ulong)in_stack_fffffffffffff860 >> 0x20));
                                    }
                                    else {
                                      Qt::Literals::StringLiterals::operator____L1
                                                ((char *)in_stack_fffffffffffff858,
                                                 (size_t)in_stack_fffffffffffff850);
                                      bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                         (QLatin1StringView *)
                                                         in_stack_fffffffffffff850);
                                      if (bVar2) {
                                        local_438 = (QWidget *)operator_new(0x30);
                                        QAccessibleProgressBar::QAccessibleProgressBar
                                                  ((QAccessibleProgressBar *)
                                                   in_stack_fffffffffffff850,
                                                   in_stack_fffffffffffff848);
                                      }
                                      else {
                                        Qt::Literals::StringLiterals::operator____L1
                                                  ((char *)in_stack_fffffffffffff858,
                                                   (size_t)in_stack_fffffffffffff850);
                                        bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                           (QLatin1StringView *)
                                                           in_stack_fffffffffffff850);
                                        if (bVar2) {
                                          local_438 = (QWidget *)operator_new(0x20);
                                          RVar5 = (Role)((ulong)in_stack_fffffffffffff860 >> 0x20);
                                          QWidget::windowTitle(in_stack_fffffffffffff858);
                                          QAccessibleWidget::QAccessibleWidget
                                                    (&in_stack_fffffffffffff870->
                                                      super_QAccessibleWidget,
                                                     in_stack_fffffffffffff868,RVar5,
                                                     (QString *)in_stack_fffffffffffff858);
                                          QString::~QString((QString *)0x7e1edc);
                                        }
                                        else {
                                          Qt::Literals::StringLiterals::operator____L1
                                                    ((char *)in_stack_fffffffffffff858,
                                                     (size_t)in_stack_fffffffffffff850);
                                          bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                             (QLatin1StringView *)
                                                             in_stack_fffffffffffff850);
                                          if (bVar2) {
                                            local_438 = (QWidget *)operator_new(0x20);
                                            QAccessibleMenuBar::QAccessibleMenuBar
                                                      ((QAccessibleMenuBar *)
                                                       in_stack_fffffffffffff860,
                                                       in_stack_fffffffffffff858);
                                          }
                                          else {
                                            Qt::Literals::StringLiterals::operator____L1
                                                      ((char *)in_stack_fffffffffffff858,
                                                       (size_t)in_stack_fffffffffffff850);
                                            bVar2 = operator==((QString *)in_stack_fffffffffffff858,
                                                               (QLatin1StringView *)
                                                               in_stack_fffffffffffff850);
                                            if (bVar2) {
                                              local_438 = (QWidget *)operator_new(0x20);
                                              QAccessibleMenu::QAccessibleMenu
                                                        ((QAccessibleMenu *)
                                                         in_stack_fffffffffffff860,
                                                         in_stack_fffffffffffff858);
                                            }
                                            else {
                                              Qt::Literals::StringLiterals::operator____L1
                                                        ((char *)in_stack_fffffffffffff858,
                                                         (size_t)in_stack_fffffffffffff850);
                                              bVar2 = operator==((QString *)
                                                                 in_stack_fffffffffffff858,
                                                                 (QLatin1StringView *)
                                                                 in_stack_fffffffffffff850);
                                              if (bVar2) {
                                                pvVar4 = operator_new(0x30);
                                                QAccessibleTree::QAccessibleTree
                                                          ((QAccessibleTree *)
                                                           in_stack_fffffffffffff850,
                                                           in_stack_fffffffffffff848);
                                                local_5e0 = (QWidget *)0x0;
                                                if (pvVar4 != (void *)0x0) {
                                                  local_5e0 = (QWidget *)((long)pvVar4 + 0x10);
                                                }
                                                local_438 = local_5e0;
                                              }
                                              else {
                                                Qt::Literals::StringLiterals::operator____L1
                                                          ((char *)in_stack_fffffffffffff858,
                                                           (size_t)in_stack_fffffffffffff850);
                                                bVar2 = operator==((QString *)
                                                                   in_stack_fffffffffffff858,
                                                                   (QLatin1StringView *)
                                                                   in_stack_fffffffffffff850);
                                                if (bVar2) {
                                                  pvVar4 = operator_new(0x30);
                                                  QAccessibleList::QAccessibleList
                                                            ((QAccessibleList *)
                                                             in_stack_fffffffffffff850,
                                                             in_stack_fffffffffffff848);
                                                  local_5f8 = (QWidget *)0x0;
                                                  if (pvVar4 != (void *)0x0) {
                                                    local_5f8 = (QWidget *)((long)pvVar4 + 0x10);
                                                  }
                                                  local_438 = local_5f8;
                                                }
                                                else {
                                                  Qt::Literals::StringLiterals::operator____L1
                                                            ((char *)in_stack_fffffffffffff858,
                                                             (size_t)in_stack_fffffffffffff850);
                                                  bVar2 = operator==((QString *)
                                                                     in_stack_fffffffffffff858,
                                                                     (QLatin1StringView *)
                                                                     in_stack_fffffffffffff850);
                                                  if (bVar2) {
                                                    pvVar4 = operator_new(0x30);
                                                    QAccessibleTable::QAccessibleTable
                                                              (in_stack_fffffffffffff850,
                                                               in_stack_fffffffffffff848);
                                                    local_610 = (QWidget *)0x0;
                                                    if (pvVar4 != (void *)0x0) {
                                                      local_610 = (QWidget *)((long)pvVar4 + 0x10);
                                                    }
                                                    local_438 = local_610;
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x30);
                                                      QAccessibleTabBar::QAccessibleTabBar
                                                                ((QAccessibleTabBar *)
                                                                 in_stack_fffffffffffff860,
                                                                 in_stack_fffffffffffff858);
                                                    }
                                                    else {
                                                      Qt::Literals::StringLiterals::operator____L1
                                                                ((char *)in_stack_fffffffffffff858,
                                                                 (size_t)in_stack_fffffffffffff850);
                                                      bVar2 = operator==((QString *)
                                                                         in_stack_fffffffffffff858,
                                                                         (QLatin1StringView *)
                                                                         in_stack_fffffffffffff850);
                                                      if (bVar2) {
                                                        local_438 = (QWidget *)operator_new(0x20);
                                                        RVar5 = (Role)((ulong)
                                                  in_stack_fffffffffffff860 >> 0x20);
                                                  QString::QString((QString *)0x7e22f2);
                                                  QAccessibleWidget::QAccessibleWidget
                                                            (&in_stack_fffffffffffff870->
                                                              super_QAccessibleWidget,
                                                             in_stack_fffffffffffff868,RVar5,
                                                             (QString *)in_stack_fffffffffffff858);
                                                  QString::~QString((QString *)0x7e2331);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      RVar5 = (Role)((ulong)
                                                  in_stack_fffffffffffff860 >> 0x20);
                                                  QString::QString((QString *)0x7e23b1);
                                                  QAccessibleWidget::QAccessibleWidget
                                                            (&in_stack_fffffffffffff870->
                                                              super_QAccessibleWidget,
                                                             in_stack_fffffffffffff868,RVar5,
                                                             (QString *)in_stack_fffffffffffff858);
                                                  QString::~QString((QString *)0x7e23f0);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      RVar5 = (Role)((ulong)
                                                  in_stack_fffffffffffff860 >> 0x20);
                                                  QString::QString((QString *)0x7e2470);
                                                  QAccessibleWidget::QAccessibleWidget
                                                            (&in_stack_fffffffffffff870->
                                                              super_QAccessibleWidget,
                                                             in_stack_fffffffffffff868,RVar5,
                                                             (QString *)in_stack_fffffffffffff858);
                                                  QString::~QString((QString *)0x7e24af);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x30);
                                                      QAccessibleTextEdit::QAccessibleTextEdit
                                                                ((QAccessibleTextEdit *)
                                                                 in_stack_fffffffffffff860,
                                                                 in_stack_fffffffffffff858);
                                                    }
                                                    else {
                                                      Qt::Literals::StringLiterals::operator____L1
                                                                ((char *)in_stack_fffffffffffff858,
                                                                 (size_t)in_stack_fffffffffffff850);
                                                      bVar2 = operator==((QString *)
                                                                         in_stack_fffffffffffff858,
                                                                         (QLatin1StringView *)
                                                                         in_stack_fffffffffffff850);
                                                      if (bVar2) {
                                                        local_438 = (QWidget *)operator_new(0x30);
                                                        QAccessiblePlainTextEdit::
                                                        QAccessiblePlainTextEdit
                                                                  ((QAccessiblePlainTextEdit *)
                                                                   in_stack_fffffffffffff860,
                                                                   in_stack_fffffffffffff858);
                                                      }
                                                      else {
                                                        Qt::Literals::StringLiterals::operator____L1
                                                                  ((char *)in_stack_fffffffffffff858
                                                                   ,(size_t)
                                                  in_stack_fffffffffffff850);
                                                  bVar2 = operator==((QString *)
                                                                     in_stack_fffffffffffff858,
                                                                     (QLatin1StringView *)
                                                                     in_stack_fffffffffffff850);
                                                  if (bVar2) {
                                                    local_438 = (QWidget *)operator_new(0x28);
                                                    QAccessibleDisplay::QAccessibleDisplay
                                                              (in_stack_fffffffffffff870,
                                                               in_stack_fffffffffffff868,
                                                               (Role)((ulong)
                                                  in_stack_fffffffffffff860 >> 0x20));
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      RVar5 = (Role)((ulong)
                                                  in_stack_fffffffffffff860 >> 0x20);
                                                  QString::QString((QString *)0x7e26bd);
                                                  QAccessibleWidget::QAccessibleWidget
                                                            (&in_stack_fffffffffffff870->
                                                              super_QAccessibleWidget,
                                                             in_stack_fffffffffffff868,RVar5,
                                                             (QString *)in_stack_fffffffffffff858);
                                                  QString::~QString((QString *)0x7e26fc);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      QAccessibleStackedWidget::
                                                      QAccessibleStackedWidget
                                                                ((QAccessibleStackedWidget *)
                                                                 in_stack_fffffffffffff860,
                                                                 in_stack_fffffffffffff858);
                                                    }
                                                    else {
                                                      Qt::Literals::StringLiterals::operator____L1
                                                                ((char *)in_stack_fffffffffffff858,
                                                                 (size_t)in_stack_fffffffffffff850);
                                                      bVar2 = operator==((QString *)
                                                                         in_stack_fffffffffffff858,
                                                                         (QLatin1StringView *)
                                                                         in_stack_fffffffffffff850);
                                                      if (bVar2) {
                                                        local_438 = (QWidget *)operator_new(0x20);
                                                        QAccessibleToolBox::QAccessibleToolBox
                                                                  ((QAccessibleToolBox *)
                                                                   in_stack_fffffffffffff860,
                                                                   in_stack_fffffffffffff858);
                                                      }
                                                      else {
                                                        Qt::Literals::StringLiterals::operator____L1
                                                                  ((char *)in_stack_fffffffffffff858
                                                                   ,(size_t)
                                                  in_stack_fffffffffffff850);
                                                  bVar2 = operator==((QString *)
                                                                     in_stack_fffffffffffff858,
                                                                     (QLatin1StringView *)
                                                                     in_stack_fffffffffffff850);
                                                  if (bVar2) {
                                                    local_438 = (QWidget *)operator_new(0x20);
                                                    QAccessibleMdiArea::QAccessibleMdiArea
                                                              ((QAccessibleMdiArea *)
                                                               in_stack_fffffffffffff860,
                                                               in_stack_fffffffffffff858);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      QAccessibleMdiSubWindow::
                                                      QAccessibleMdiSubWindow
                                                                ((QAccessibleMdiSubWindow *)
                                                                 in_stack_fffffffffffff860,
                                                                 in_stack_fffffffffffff858);
                                                    }
                                                    else {
                                                      Qt::Literals::StringLiterals::operator____L1
                                                                ((char *)in_stack_fffffffffffff858,
                                                                 (size_t)in_stack_fffffffffffff850);
                                                      bVar2 = operator==((QString *)
                                                                         in_stack_fffffffffffff858,
                                                                         (QLatin1StringView *)
                                                                         in_stack_fffffffffffff850);
                                                      if (bVar2) {
                                                        local_438 = (QWidget *)operator_new(0x20);
                                                        QAccessibleDialogButtonBox::
                                                        QAccessibleDialogButtonBox
                                                                  ((QAccessibleDialogButtonBox *)
                                                                   in_stack_fffffffffffff860,
                                                                   in_stack_fffffffffffff858);
                                                      }
                                                      else {
                                                        Qt::Literals::StringLiterals::operator____L1
                                                                  ((char *)in_stack_fffffffffffff858
                                                                   ,(size_t)
                                                  in_stack_fffffffffffff850);
                                                  bVar2 = operator==((QString *)
                                                                     in_stack_fffffffffffff858,
                                                                     (QLatin1StringView *)
                                                                     in_stack_fffffffffffff850);
                                                  if (bVar2) {
                                                    local_438 = (QWidget *)operator_new(0x28);
                                                    QAccessibleDial::QAccessibleDial
                                                              ((QAccessibleDial *)
                                                               in_stack_fffffffffffff870,
                                                               in_stack_fffffffffffff868);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      RVar5 = (Role)((ulong)
                                                  in_stack_fffffffffffff860 >> 0x20);
                                                  QString::QString((QString *)0x7e2a8e);
                                                  QAccessibleWidget::QAccessibleWidget
                                                            (&in_stack_fffffffffffff870->
                                                              super_QAccessibleWidget,
                                                             in_stack_fffffffffffff868,RVar5,
                                                             (QString *)in_stack_fffffffffffff858);
                                                  QString::~QString((QString *)0x7e2acd);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x30);
                                                      QAccessibleTextBrowser::QAccessibleTextBrowser
                                                                ((QAccessibleTextBrowser *)
                                                                 in_stack_fffffffffffff850,
                                                                 in_stack_fffffffffffff848);
                                                    }
                                                    else {
                                                      Qt::Literals::StringLiterals::operator____L1
                                                                ((char *)in_stack_fffffffffffff858,
                                                                 (size_t)in_stack_fffffffffffff850);
                                                      bVar2 = operator==((QString *)
                                                                         in_stack_fffffffffffff858,
                                                                         (QLatin1StringView *)
                                                                         in_stack_fffffffffffff850);
                                                      if (bVar2) {
                                                        local_438 = (QWidget *)operator_new(0x20);
                                                        QAccessibleAbstractScrollArea::
                                                        QAccessibleAbstractScrollArea
                                                                  ((QAccessibleAbstractScrollArea *)
                                                                   in_stack_fffffffffffff860,
                                                                   in_stack_fffffffffffff858);
                                                      }
                                                      else {
                                                        Qt::Literals::StringLiterals::operator____L1
                                                                  ((char *)in_stack_fffffffffffff858
                                                                   ,(size_t)
                                                  in_stack_fffffffffffff850);
                                                  bVar2 = operator==((QString *)
                                                                     in_stack_fffffffffffff858,
                                                                     (QLatin1StringView *)
                                                                     in_stack_fffffffffffff850);
                                                  if (bVar2) {
                                                    local_438 = (QWidget *)operator_new(0x20);
                                                    QAccessibleScrollArea::QAccessibleScrollArea
                                                              ((QAccessibleScrollArea *)
                                                               in_stack_fffffffffffff850,
                                                               in_stack_fffffffffffff848);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      QAccessibleCalendarWidget::
                                                      QAccessibleCalendarWidget
                                                                ((QAccessibleCalendarWidget *)
                                                                 in_stack_fffffffffffff860,
                                                                 in_stack_fffffffffffff858);
                                                    }
                                                    else {
                                                      Qt::Literals::StringLiterals::operator____L1
                                                                ((char *)in_stack_fffffffffffff858,
                                                                 (size_t)in_stack_fffffffffffff850);
                                                      bVar2 = operator==((QString *)
                                                                         in_stack_fffffffffffff858,
                                                                         (QLatin1StringView *)
                                                                         in_stack_fffffffffffff850);
                                                      if (bVar2) {
                                                        local_438 = (QWidget *)operator_new(0x20);
                                                        QAccessibleDockWidget::QAccessibleDockWidget
                                                                  ((QAccessibleDockWidget *)
                                                                   in_stack_fffffffffffff860,
                                                                   in_stack_fffffffffffff858);
                                                      }
                                                      else {
                                                        Qt::Literals::StringLiterals::operator____L1
                                                                  ((char *)in_stack_fffffffffffff858
                                                                   ,(size_t)
                                                  in_stack_fffffffffffff850);
                                                  RVar5 = (Role)((ulong)in_stack_fffffffffffff860 >>
                                                                0x20);
                                                  bVar2 = operator==((QString *)
                                                                     in_stack_fffffffffffff858,
                                                                     (QLatin1StringView *)
                                                                     in_stack_fffffffffffff850);
                                                  if (bVar2) {
                                                    local_438 = (QWidget *)operator_new(0x20);
                                                    QString::QString((QString *)0x7e2d9a);
                                                    QAccessibleWidget::QAccessibleWidget
                                                              ((QAccessibleWidget *)local_438,in_RSI
                                                               ,RVar5,(QString *)
                                                                      in_stack_fffffffffffff858);
                                                    QString::~QString((QString *)0x7e2dd0);
                                                  }
                                                  else {
                                                    Qt::Literals::StringLiterals::operator____L1
                                                              ((char *)in_stack_fffffffffffff858,
                                                               (size_t)in_stack_fffffffffffff850);
                                                    bVar2 = operator==((QString *)
                                                                       in_stack_fffffffffffff858,
                                                                       (QLatin1StringView *)
                                                                       in_stack_fffffffffffff850);
                                                    if (bVar2) {
                                                      local_438 = (QWidget *)operator_new(0x20);
                                                      QAccessibleWindowContainer::
                                                      QAccessibleWindowContainer(in_RDI,local_438);
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
                                  local_438 = (QWidget *)operator_new(0x28);
                                  QAccessibleDisplay::QAccessibleDisplay
                                            (in_stack_fffffffffffff870,in_stack_fffffffffffff868,
                                             (Role)((ulong)in_stack_fffffffffffff860 >> 0x20));
                                }
                              }
                            }
                          }
                        }
                        else {
                          local_438 = (QWidget *)operator_new(0x20);
                          QAccessibleButton::QAccessibleButton
                                    ((QAccessibleButton *)in_stack_fffffffffffff880,
                                     in_stack_fffffffffffff878);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_420 = local_438;
    }
    else {
      local_420 = (QWidget *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QAccessibleInterface *)local_420;
}

Assistant:

QAccessibleInterface *qAccessibleFactory(const QString &classname, QObject *object)
{
    QAccessibleInterface *iface = nullptr;
    if (!object || !object->isWidgetType())
        return iface;

    QWidget *widget = static_cast<QWidget*>(object);
    // QWidget emits destroyed() from its destructor instead of letting the QObject
    // destructor do it, which means the QWidget is unregistered from the accessibillity
    // cache. But QWidget destruction also emits enter and leave events, which may end
    // up here, so we have to ensure that we don't fill the cache with an entry of
    // a widget that is going away.
    if (QWidgetPrivate::get(widget)->data.in_destructor)
        return iface;

    if (false) {
#if QT_CONFIG(lineedit)
    } else if (classname == "QLineEdit"_L1) {
        if (widget->objectName() == "qt_spinbox_lineedit"_L1)
            iface = nullptr;
        else
            iface = new QAccessibleLineEdit(widget);
#endif
#if QT_CONFIG(combobox)
    } else if (classname == "QComboBox"_L1) {
        iface = new QAccessibleComboBox(widget);
#endif
#if QT_CONFIG(spinbox)
    } else if (classname == "QAbstractSpinBox"_L1) {
        iface = new QAccessibleAbstractSpinBox(widget);
    } else if (classname == "QSpinBox"_L1) {
        iface = new QAccessibleSpinBox(widget);
    } else if (classname == "QDoubleSpinBox"_L1) {
        iface = new QAccessibleDoubleSpinBox(widget);
#endif
#if QT_CONFIG(scrollbar)
    } else if (classname == "QScrollBar"_L1) {
        iface = new QAccessibleScrollBar(widget);
#endif
#if QT_CONFIG(slider)
    } else if (classname == "QAbstractSlider"_L1) {
        iface = new QAccessibleAbstractSlider(widget);
    } else if (classname == "QSlider"_L1) {
        iface = new QAccessibleSlider(widget);
#endif
#if QT_CONFIG(toolbutton)
    } else if (classname == "QToolButton"_L1) {
        iface = new QAccessibleToolButton(widget);
#endif // QT_CONFIG(toolbutton)
#if QT_CONFIG(abstractbutton)
    } else if (classname == "QCheckBox"_L1
            || classname == "QRadioButton"_L1
            || classname == "QPushButton"_L1
            || classname == "QAbstractButton"_L1) {
        iface = new QAccessibleButton(widget);
#endif
    } else if (classname == "QDialog"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Dialog);
#if QT_CONFIG(messagebox)
    } else if (classname == "QMessageBox"_L1) {
        iface = new QAccessibleMessageBox(widget);
#endif
#if QT_CONFIG(mainwindow)
    } else if (classname == "QMainWindow"_L1) {
        iface = new QAccessibleMainWindow(widget);
#endif
    } else if (classname == "QLabel"_L1 || classname == "QLCDNumber"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(groupbox)
    } else if (classname == "QGroupBox"_L1) {
        iface = new QAccessibleGroupBox(widget);
#endif
    } else if (classname == "QStatusBar"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(progressbar)
    } else if (classname == "QProgressBar"_L1) {
        iface = new QAccessibleProgressBar(widget);
#endif
    } else if (classname == "QToolBar"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::ToolBar, widget->windowTitle());
#if QT_CONFIG(menubar)
    } else if (classname == "QMenuBar"_L1) {
        iface = new QAccessibleMenuBar(widget);
#endif
#if QT_CONFIG(menu)
    } else if (classname == "QMenu"_L1) {
        iface = new QAccessibleMenu(widget);
#endif
#if QT_CONFIG(treeview)
    } else if (classname == "QTreeView"_L1) {
        iface = new QAccessibleTree(widget);
#endif // QT_CONFIG(treeview)
#if QT_CONFIG(listview)
    } else if (classname == "QListView"_L1) {
        iface = new QAccessibleList(widget);
#endif
#if QT_CONFIG(itemviews)
    } else if (classname == "QTableView"_L1) {
        iface = new QAccessibleTable(widget);
#endif // QT_CONFIG(itemviews)
#if QT_CONFIG(tabbar)
    } else if (classname == "QTabBar"_L1) {
        iface = new QAccessibleTabBar(widget);
#endif
    } else if (classname == "QSizeGrip"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#if QT_CONFIG(splitter)
    } else if (classname == "QSplitter"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Splitter);
    } else if (classname == "QSplitterHandle"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#endif
#if QT_CONFIG(textedit) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextEdit"_L1) {
        iface = new QAccessibleTextEdit(widget);
    } else if (classname == "QPlainTextEdit"_L1) {
        iface = new QAccessiblePlainTextEdit(widget);
#endif
    } else if (classname == "QTipLabel"_L1) {
        iface = new QAccessibleDisplay(widget, QAccessible::ToolTip);
    } else if (classname == "QFrame"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#if QT_CONFIG(stackedwidget)
    } else if (classname == "QStackedWidget"_L1) {
        iface = new QAccessibleStackedWidget(widget);
#endif
#if QT_CONFIG(toolbox)
    } else if (classname == "QToolBox"_L1) {
        iface = new QAccessibleToolBox(widget);
#endif
#if QT_CONFIG(mdiarea)
    } else if (classname == "QMdiArea"_L1) {
        iface = new QAccessibleMdiArea(widget);
    } else if (classname == "QMdiSubWindow"_L1) {
        iface = new QAccessibleMdiSubWindow(widget);
#endif
#if QT_CONFIG(dialogbuttonbox)
    } else if (classname == "QDialogButtonBox"_L1) {
        iface = new QAccessibleDialogButtonBox(widget);
#endif
#if QT_CONFIG(dial)
    } else if (classname == "QDial"_L1) {
        iface = new QAccessibleDial(widget);
#endif
#if QT_CONFIG(rubberband)
    } else if (classname == "QRubberBand"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#endif
#if QT_CONFIG(textbrowser) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextBrowser"_L1) {
        iface = new QAccessibleTextBrowser(widget);
#endif
#if QT_CONFIG(scrollarea)
    } else if (classname == "QAbstractScrollArea"_L1) {
        iface = new QAccessibleAbstractScrollArea(widget);
    } else if (classname == "QScrollArea"_L1) {
        iface = new QAccessibleScrollArea(widget);
#endif
#if QT_CONFIG(calendarwidget)
    } else if (classname == "QCalendarWidget"_L1) {
        iface = new QAccessibleCalendarWidget(widget);
#endif
#if QT_CONFIG(dockwidget)
    } else if (classname == "QDockWidget"_L1) {
        iface = new QAccessibleDockWidget(widget);
#endif

    } else if (classname == "QWidget"_L1) {
        iface = new QAccessibleWidget(widget);
    } else if (classname == "QWindowContainer"_L1) {
        iface = new QAccessibleWindowContainer(widget);
    }

    return iface;
}